

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1b6d1::
ARTOOMTest_Node256KeyPrefixSplit_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node256KeyPrefixSplit_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  __atomic_base<unsigned_long> _Var3;
  bool bVar4;
  undefined **ppuVar5;
  undefined **ppuVar6;
  ulong k;
  value_view v;
  value_view v_00;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined8 local_540;
  __atomic_base<unsigned_long> local_530;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_528 [4];
  AssertHelper local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  local_530._M_i = 1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  k = 0x14;
  ppuVar6 = &PTR_typeinfo_001fd2d0;
  ppuVar5 = &PTR__Test_001fd2d8;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = k;
    uVar2 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffc;
    v._M_extent._M_extent_value = (size_t)ppuVar5[uVar2 * -3];
    v._M_ptr = ppuVar6[uVar2 * -3];
    unodb::test::
    tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal(&local_500,k,v,false);
    k = k + 1;
    ppuVar5 = ppuVar5 + 2;
    ppuVar6 = ppuVar6 + 2;
  } while (k != 0x45);
  local_560._M_dataplus._M_p = (pointer)0x31;
  local_560._M_string_length = 0;
  local_560.field_2._M_allocated_capacity = 0;
  local_560.field_2._8_8_ = 0;
  local_540 = 1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts(&local_500,(node_type_counter_array *)&local_560);
  _Var3._M_i = local_530._M_i;
  local_560._M_dataplus._M_p = (pointer)0x1;
  local_560._M_string_length = 1;
  local_560.field_2._M_allocated_capacity = 1;
  local_560.field_2._8_8_ = 1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes(&local_500,(inode_type_counter_array *)&local_560);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_key_prefix_splits(&local_500,0);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
  local_560.field_2._M_allocated_capacity = 0;
  local_560.field_2._8_8_ = 0;
  local_560._M_string_length = 0;
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    v_00._M_extent._M_extent_value = 1;
    v_00._M_ptr = &unodb::test::test_value_1;
    unodb::test::
    tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal(&local_500,0x100020,v_00,false);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_560,0,local_560._M_string_length,
             "Expected: test(verifier) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
             ,0x61);
  testing::Message::Message((Message *)local_528);
  testing::internal::AssertHelper::AssertHelper
            (&local_508,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_oom.cpp"
             ,0x30,local_560._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_508,(Message *)local_528);
  testing::internal::AssertHelper::~AssertHelper(&local_508);
  if (local_528[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_528[0]._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
            (&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node256KeyPrefixSplit) {
  oom_insert_test<TypeParam>(
      3,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(20, 49);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({49, 0, 0, 0, 1});
        verifier.assert_growing_inodes({1, 1, 1, 1});
        verifier.assert_key_prefix_splits(0);
#endif  // UNODB_DETAIL_WITH_STATS
      },
      // Insert a value that does share full prefix with the current Node48
      0x100020, unodb::test::test_values[0],
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({50, 1, 0, 0, 1});
        verifier.assert_growing_inodes({2, 1, 1, 1});
        verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
      });
}